

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

void __thiscall
wallet::CWallet::AddActiveScriptPubKeyMan(CWallet *this,uint256 id,OutputType type,bool internal)

{
  long lVar1;
  uint256 id_00;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  WalletBatch *in_stack_00000008;
  undefined1 uStack0000000000000050;
  undefined1 uStack0000000000000051;
  undefined1 uStack0000000000000052;
  WalletBatch batch;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 _fFlushOnClose;
  WalletDatabase *in_stack_ffffffffffffff70;
  CWallet *in_stack_ffffffffffffff78;
  WalletBatch *in_stack_ffffffffffffffc8;
  CWallet *in_stack_ffffffffffffffd0;
  
  _fFlushOnClose = (undefined1)((ulong)in_stack_ffffffffffffff68 >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  GetDatabase(in_stack_ffffffffffffff78);
  WalletBatch::WalletBatch
            ((WalletBatch *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(bool)_fFlushOnClose
            );
  id_00.super_base_blob<256U>.m_data._M_elems._4_4_ = type;
  id_00.super_base_blob<256U>.m_data._M_elems[0] = uStack0000000000000050;
  id_00.super_base_blob<256U>.m_data._M_elems[1] = uStack0000000000000051;
  id_00.super_base_blob<256U>.m_data._M_elems[2] = uStack0000000000000052;
  id_00.super_base_blob<256U>.m_data._M_elems[3] = internal;
  id_00.super_base_blob<256U>.m_data._M_elems._8_8_ = this;
  id_00.super_base_blob<256U>.m_data._M_elems._16_16_ = batch;
  AddActiveScriptPubKeyManWithDb
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,id_00,
             (OutputType)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  WalletBatch::~WalletBatch(in_stack_00000008);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::AddActiveScriptPubKeyMan(uint256 id, OutputType type, bool internal)
{
    WalletBatch batch(GetDatabase());
    return AddActiveScriptPubKeyManWithDb(batch, id, type, internal);
}